

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::
SubscriptionTest_TestMergingPriceMapWithFewerBidLevelsClearsExcessLevels_Test::TestBody
          (SubscriptionTest_TestMergingPriceMapWithFewerBidLevelsClearsExcessLevels_Test *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  *pmVar3;
  char *pcVar4;
  AssertHelper local_2e70;
  Message local_2e68;
  allocator<char> local_2e59;
  key_type local_2e58;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2e38;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2e30;
  undefined1 local_2e28 [8];
  AssertionResult gtest_ar_71;
  Message local_2e10;
  allocator<char> local_2e01;
  key_type local_2e00;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2de0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2dd8;
  undefined1 local_2dd0 [8];
  AssertionResult gtest_ar_70;
  Message local_2db8;
  allocator<char> local_2da9;
  key_type local_2da8;
  double local_2d88;
  double local_2d80;
  undefined1 local_2d78 [8];
  AssertionResult gtest_ar_69;
  Message local_2d60;
  allocator<char> local_2d51;
  key_type local_2d50;
  double local_2d30;
  double local_2d28;
  undefined1 local_2d20 [8];
  AssertionResult gtest_ar_68;
  Message local_2d08;
  allocator<char> local_2cf9;
  key_type local_2cf8;
  double local_2cd8;
  double local_2cd0;
  undefined1 local_2cc8 [8];
  AssertionResult gtest_ar_67;
  Message local_2cb0;
  allocator<char> local_2ca1;
  key_type local_2ca0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2c80;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2c78;
  undefined1 local_2c70 [8];
  AssertionResult gtest_ar_66;
  Message local_2c58;
  allocator<char> local_2c49;
  key_type local_2c48;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2c28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2c20;
  undefined1 local_2c18 [8];
  AssertionResult gtest_ar_65;
  Message local_2c00;
  allocator<char> local_2bf1;
  key_type local_2bf0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2bd0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2bc8;
  undefined1 local_2bc0 [8];
  AssertionResult gtest_ar_64;
  Message local_2ba8;
  allocator<char> local_2b99;
  key_type local_2b98;
  double local_2b78;
  double local_2b70;
  undefined1 local_2b68 [8];
  AssertionResult gtest_ar_63;
  Message local_2b50;
  allocator<char> local_2b41;
  key_type local_2b40;
  double local_2b20;
  double local_2b18;
  undefined1 local_2b10 [8];
  AssertionResult gtest_ar_62;
  Message local_2af8;
  allocator<char> local_2ae9;
  key_type local_2ae8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2ac8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2ac0;
  undefined1 local_2ab8 [8];
  AssertionResult gtest_ar_61;
  Message local_2aa0;
  allocator<char> local_2a91;
  key_type local_2a90;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2a70;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2a68;
  undefined1 local_2a60 [8];
  AssertionResult gtest_ar_60;
  Message local_2a48;
  allocator<char> local_2a39;
  key_type local_2a38;
  double local_2a18;
  double local_2a10;
  undefined1 local_2a08 [8];
  AssertionResult gtest_ar_59;
  Message local_29f0;
  allocator<char> local_29e1;
  key_type local_29e0;
  double local_29c0;
  double local_29b8;
  undefined1 local_29b0 [8];
  AssertionResult gtest_ar_58;
  Message local_2998;
  allocator<char> local_2989;
  key_type local_2988;
  double local_2968;
  double local_2960;
  undefined1 local_2958 [8];
  AssertionResult gtest_ar_57;
  Message local_2940;
  allocator<char> local_2931;
  key_type local_2930;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2910;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2908;
  undefined1 local_2900 [8];
  AssertionResult gtest_ar_56;
  Message local_28e8;
  allocator<char> local_28d9;
  key_type local_28d8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_28b8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_28b0;
  undefined1 local_28a8 [8];
  AssertionResult gtest_ar_55;
  Message local_2890;
  allocator<char> local_2881;
  key_type local_2880;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2860;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2858;
  undefined1 local_2850 [8];
  AssertionResult gtest_ar_54;
  Message local_2838;
  allocator<char> local_2829;
  key_type local_2828;
  double local_2808;
  double local_2800;
  undefined1 local_27f8 [8];
  AssertionResult gtest_ar_53;
  Message local_27e0;
  allocator<char> local_27d1;
  key_type local_27d0;
  double local_27b0;
  double local_27a8;
  undefined1 local_27a0 [8];
  AssertionResult gtest_ar_52;
  Message local_2788;
  allocator<char> local_2779;
  key_type local_2778;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2758;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2750;
  undefined1 local_2748 [8];
  AssertionResult gtest_ar_51;
  Message local_2730;
  allocator<char> local_2721;
  key_type local_2720;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2700;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_26f8;
  undefined1 local_26f0 [8];
  AssertionResult gtest_ar_50;
  Message local_26d8;
  allocator<char> local_26c9;
  key_type local_26c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26a8;
  undefined1 local_2688 [8];
  AssertionResult gtest_ar_49;
  Message local_2670;
  allocator<char> local_2661;
  key_type local_2660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2640;
  undefined1 local_2620 [8];
  AssertionResult gtest_ar_48;
  Message local_2608;
  allocator<char> local_25f9;
  key_type local_25f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25d8;
  undefined1 local_25b8 [8];
  AssertionResult gtest_ar_47;
  Message local_25a0;
  allocator<char> local_2591;
  key_type local_2590;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2570;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2568;
  undefined1 local_2560 [8];
  AssertionResult gtest_ar_46;
  Message local_2548;
  allocator<char> local_2539;
  key_type local_2538;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2518;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2510;
  undefined1 local_2508 [8];
  AssertionResult gtest_ar_45;
  Message local_24f0;
  allocator<char> local_24e1;
  key_type local_24e0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_24c0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_24b8;
  undefined1 local_24b0 [8];
  AssertionResult gtest_ar_44;
  Message local_2498;
  allocator<char> local_2489;
  key_type local_2488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2468;
  undefined1 local_2448 [8];
  AssertionResult gtest_ar_43;
  Message local_2430;
  allocator<char> local_2421;
  key_type local_2420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2400;
  undefined1 local_23e0 [8];
  AssertionResult gtest_ar_42;
  Message local_23c8;
  allocator<char> local_23b9;
  key_type local_23b8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2398;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2390;
  undefined1 local_2388 [8];
  AssertionResult gtest_ar_41;
  Message local_2370;
  allocator<char> local_2361;
  key_type local_2360;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2340;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2338;
  undefined1 local_2330 [8];
  AssertionResult gtest_ar_40;
  Message local_2318;
  allocator<char> local_2309;
  key_type local_2308;
  long local_22e8;
  int local_22dc;
  undefined1 local_22d8 [8];
  AssertionResult gtest_ar_39;
  Message local_22c0;
  allocator<char> local_22b1;
  key_type local_22b0;
  long local_2290;
  int local_2284;
  undefined1 local_2280 [8];
  AssertionResult gtest_ar_38;
  Message local_2268;
  allocator<char> local_2259;
  key_type local_2258;
  long local_2238;
  int local_222c;
  undefined1 local_2228 [8];
  AssertionResult gtest_ar_37;
  Message local_2210;
  allocator<char> local_2201;
  key_type local_2200;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_21e0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_21d8;
  undefined1 local_21d0 [8];
  AssertionResult gtest_ar_36;
  Message local_21b8;
  allocator<char> local_21a9;
  key_type local_21a8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2188;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2180;
  undefined1 local_2178 [8];
  AssertionResult gtest_ar_35;
  Message local_2160;
  allocator<char> local_2151;
  key_type local_2150;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2130;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2128;
  undefined1 local_2120 [8];
  AssertionResult gtest_ar_34;
  Message local_2108;
  allocator<char> local_20f9;
  key_type local_20f8;
  long local_20d8;
  int local_20cc;
  undefined1 local_20c8 [8];
  AssertionResult gtest_ar_33;
  Message local_20b0;
  allocator<char> local_20a1;
  key_type local_20a0;
  long local_2080;
  int local_2074;
  undefined1 local_2070 [8];
  AssertionResult gtest_ar_32;
  Message local_2058;
  allocator<char> local_2049;
  key_type local_2048;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2028;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_2020;
  undefined1 local_2018 [8];
  AssertionResult gtest_ar_31;
  Message local_2000;
  allocator<char> local_1ff1;
  key_type local_1ff0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1fd0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1fc8;
  undefined1 local_1fc0 [8];
  AssertionResult gtest_ar_30;
  Message local_1fa8;
  allocator<char> local_1f99;
  key_type local_1f98;
  double local_1f78;
  double local_1f70;
  undefined1 local_1f68 [8];
  AssertionResult gtest_ar_29;
  Message local_1f50;
  allocator<char> local_1f41;
  key_type local_1f40;
  double local_1f20;
  double local_1f18;
  undefined1 local_1f10 [8];
  AssertionResult gtest_ar_28;
  Message local_1ef8;
  allocator<char> local_1ee9;
  key_type local_1ee8;
  double local_1ec8;
  double local_1ec0;
  undefined1 local_1eb8 [8];
  AssertionResult gtest_ar_27;
  Message local_1ea0;
  allocator<char> local_1e91;
  key_type local_1e90;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1e70;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1e68;
  undefined1 local_1e60 [8];
  AssertionResult gtest_ar_26;
  Message local_1e48;
  allocator<char> local_1e39;
  key_type local_1e38;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1e18;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1e10;
  undefined1 local_1e08 [8];
  AssertionResult gtest_ar_25;
  Message local_1df0;
  allocator<char> local_1de1;
  key_type local_1de0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1dc0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1db8;
  undefined1 local_1db0 [8];
  AssertionResult gtest_ar_24;
  Message local_1d98;
  allocator<char> local_1d89;
  key_type local_1d88;
  double local_1d68;
  double local_1d60;
  undefined1 local_1d58 [8];
  AssertionResult gtest_ar_23;
  Message local_1d40;
  allocator<char> local_1d31;
  key_type local_1d30;
  double local_1d10;
  double local_1d08;
  undefined1 local_1d00 [8];
  AssertionResult gtest_ar_22;
  Message local_1ce8;
  allocator<char> local_1cd9;
  key_type local_1cd8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1cb8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1cb0;
  undefined1 local_1ca8 [8];
  AssertionResult gtest_ar_21;
  Message local_1c90;
  allocator<char> local_1c81;
  key_type local_1c80;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1c60;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1c58;
  undefined1 local_1c50 [8];
  AssertionResult gtest_ar_20;
  Message local_1c38;
  allocator<char> local_1c29;
  key_type local_1c28;
  long local_1c08;
  int local_1bfc;
  undefined1 local_1bf8 [8];
  AssertionResult gtest_ar_19;
  Message local_1be0;
  allocator<char> local_1bd1;
  key_type local_1bd0;
  long local_1bb0;
  int local_1ba4;
  undefined1 local_1ba0 [8];
  AssertionResult gtest_ar_18;
  Message local_1b88;
  allocator<char> local_1b79;
  key_type local_1b78;
  long local_1b58;
  int local_1b4c;
  undefined1 local_1b48 [8];
  AssertionResult gtest_ar_17;
  Message local_1b30;
  allocator<char> local_1b21;
  key_type local_1b20;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1b00;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1af8;
  undefined1 local_1af0 [8];
  AssertionResult gtest_ar_16;
  Message local_1ad8;
  allocator<char> local_1ac9;
  key_type local_1ac8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1aa8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1aa0;
  undefined1 local_1a98 [8];
  AssertionResult gtest_ar_15;
  Message local_1a80;
  allocator<char> local_1a71;
  key_type local_1a70;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1a50;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1a48;
  undefined1 local_1a40 [8];
  AssertionResult gtest_ar_14;
  Message local_1a28;
  allocator<char> local_1a19;
  key_type local_1a18;
  long local_19f8;
  int local_19ec;
  undefined1 local_19e8 [8];
  AssertionResult gtest_ar_13;
  Message local_19d0;
  allocator<char> local_19c1;
  key_type local_19c0;
  long local_19a0;
  int local_1994;
  undefined1 local_1990 [8];
  AssertionResult gtest_ar_12;
  Message local_1978;
  allocator<char> local_1969;
  key_type local_1968;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1948;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1940;
  undefined1 local_1938 [8];
  AssertionResult gtest_ar_11;
  Message local_1920;
  allocator<char> local_1911;
  key_type local_1910;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_18f0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_18e8;
  undefined1 local_18e0 [8];
  AssertionResult gtest_ar_10;
  Message local_18c8;
  allocator<char> local_18b9;
  key_type local_18b8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1898;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1890;
  undefined1 local_1888 [8];
  AssertionResult gtest_ar_9;
  Message local_1870;
  allocator<char> local_1861;
  key_type local_1860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1840;
  undefined1 local_1820 [8];
  AssertionResult gtest_ar_8;
  Message local_1808;
  allocator<char> local_17f9;
  key_type local_17f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17d8;
  undefined1 local_17b8 [8];
  AssertionResult gtest_ar_7;
  Message local_17a0;
  allocator<char> local_1791;
  key_type local_1790;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1770;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1768;
  undefined1 local_1760 [8];
  AssertionResult gtest_ar_6;
  Message local_1748;
  allocator<char> local_1739;
  key_type local_1738;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1718;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>
  local_1710;
  undefined1 local_1708 [8];
  AssertionResult gtest_ar_5;
  Message local_16f0;
  allocator<char> local_16e1;
  key_type local_16e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16c0;
  undefined1 local_16a0 [8];
  AssertionResult gtest_ar_4;
  Message local_1688;
  allocator<char> local_1679;
  key_type local_1678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1658;
  undefined1 local_1638 [8];
  AssertionResult gtest_ar_3;
  Message local_1620;
  allocator<char> local_1611;
  key_type local_1610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15f0;
  undefined1 local_15d0 [8];
  AssertionResult gtest_ar_2;
  Message local_15b8;
  allocator<char> local_15a9;
  key_type local_15a8;
  int local_1588 [2];
  undefined1 local_1580 [8];
  AssertionResult gtest_ar_1;
  Message local_1568;
  allocator<char> local_1559;
  key_type local_1558;
  int local_1538 [2];
  undefined1 local_1530 [8];
  AssertionResult gtest_ar;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  result;
  key_type local_14e8;
  allocator<char> local_14c1;
  string local_14c0 [32];
  PriceField local_14a0 [23];
  allocator<char> local_1489;
  key_type local_1488;
  allocator<char> local_1461;
  string local_1460 [32];
  PriceField local_1440 [23];
  allocator<char> local_1429;
  key_type local_1428;
  allocator<char> local_1401;
  string local_1400 [32];
  PriceField local_13e0 [23];
  allocator<char> local_13c9;
  key_type local_13c8;
  PriceField local_13a8 [23];
  allocator<char> local_1391;
  key_type local_1390;
  PriceField local_1370 [16];
  undefined1 local_1360 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  new_price_map;
  key_type local_1328;
  PriceField local_1308 [23];
  allocator<char> local_12f1;
  key_type local_12f0;
  PriceField local_12d0 [23];
  allocator<char> local_12b9;
  key_type local_12b8;
  PriceField local_1298 [23];
  allocator<char> local_1281;
  key_type local_1280;
  PriceField local_1260 [23];
  allocator<char> local_1249;
  key_type local_1248;
  PriceField local_1228 [23];
  allocator<char> local_1211;
  key_type local_1210;
  PriceField local_11f0 [23];
  allocator<char> local_11d9;
  key_type local_11d8;
  PriceField local_11b8 [23];
  allocator<char> local_11a1;
  key_type local_11a0;
  PriceField local_1180 [23];
  allocator<char> local_1169;
  key_type local_1168;
  PriceField local_1148 [23];
  allocator<char> local_1131;
  key_type local_1130;
  PriceField local_1110 [23];
  allocator<char> local_10f9;
  key_type local_10f8;
  PriceField local_10d8 [23];
  allocator<char> local_10c1;
  key_type local_10c0;
  PriceField local_10a0 [23];
  allocator<char> local_1089;
  key_type local_1088;
  PriceField local_1068 [23];
  allocator<char> local_1051;
  key_type local_1050;
  PriceField local_1030 [23];
  allocator<char> local_1019;
  key_type local_1018;
  PriceField local_ff8 [23];
  allocator<char> local_fe1;
  key_type local_fe0;
  PriceField local_fc0 [23];
  allocator<char> local_fa9;
  key_type local_fa8;
  PriceField local_f88 [23];
  allocator<char> local_f71;
  key_type local_f70;
  PriceField local_f50 [23];
  allocator<char> local_f39;
  key_type local_f38;
  PriceField local_f18 [23];
  allocator<char> local_f01;
  key_type local_f00;
  PriceField local_ee0 [23];
  allocator<char> local_ec9;
  key_type local_ec8;
  allocator<char> local_ea1;
  string local_ea0 [32];
  PriceField local_e80 [23];
  allocator<char> local_e69;
  key_type local_e68;
  allocator<char> local_e41;
  string local_e40 [32];
  PriceField local_e20 [23];
  allocator<char> local_e09;
  key_type local_e08;
  allocator<char> local_de1;
  string local_de0 [32];
  PriceField local_dc0 [23];
  allocator<char> local_da9;
  key_type local_da8;
  allocator<char> local_d81;
  string local_d80 [32];
  PriceField local_d60 [23];
  allocator<char> local_d49;
  key_type local_d48;
  allocator<char> local_d21;
  string local_d20 [32];
  PriceField local_d00 [23];
  allocator<char> local_ce9;
  key_type local_ce8;
  allocator<char> local_cc1;
  string local_cc0 [32];
  PriceField local_ca0 [23];
  allocator<char> local_c89;
  key_type local_c88;
  allocator<char> local_c61;
  string local_c60 [32];
  PriceField local_c40 [23];
  allocator<char> local_c29;
  key_type local_c28;
  allocator<char> local_c01;
  string local_c00 [32];
  PriceField local_be0 [23];
  allocator<char> local_bc9;
  key_type local_bc8;
  allocator<char> local_ba1;
  string local_ba0 [32];
  PriceField local_b80 [23];
  allocator<char> local_b69;
  key_type local_b68;
  allocator<char> local_b41;
  string local_b40 [32];
  PriceField local_b20 [23];
  allocator<char> local_b09;
  key_type local_b08;
  PriceField local_ae8 [23];
  allocator<char> local_ad1;
  key_type local_ad0;
  PriceField local_ab0 [23];
  allocator<char> local_a99;
  key_type local_a98;
  PriceField local_a78 [23];
  allocator<char> local_a61;
  key_type local_a60;
  PriceField local_a40 [23];
  allocator<char> local_a29;
  key_type local_a28;
  PriceField local_a08 [23];
  allocator<char> local_9f1;
  key_type local_9f0;
  PriceField local_9d0 [23];
  allocator<char> local_9b9;
  key_type local_9b8;
  PriceField local_998 [23];
  allocator<char> local_981;
  key_type local_980;
  PriceField local_960 [23];
  allocator<char> local_949;
  key_type local_948;
  PriceField local_928 [23];
  allocator<char> local_911;
  key_type local_910;
  PriceField local_8f0 [23];
  allocator<char> local_8d9;
  key_type local_8d8;
  PriceField local_8b8 [23];
  allocator<char> local_8a1;
  key_type local_8a0;
  PriceField local_880 [23];
  allocator<char> local_869;
  key_type local_868;
  PriceField local_848 [23];
  allocator<char> local_831;
  key_type local_830;
  PriceField local_810 [23];
  allocator<char> local_7f9;
  key_type local_7f8;
  PriceField local_7d8 [23];
  allocator<char> local_7c1;
  key_type local_7c0;
  PriceField local_7a0 [23];
  allocator<char> local_789;
  key_type local_788;
  PriceField local_768 [23];
  allocator<char> local_751;
  key_type local_750;
  PriceField local_730 [23];
  allocator<char> local_719;
  key_type local_718;
  PriceField local_6f8 [23];
  allocator<char> local_6e1;
  key_type local_6e0;
  PriceField local_6c0 [23];
  allocator<char> local_6a9;
  key_type local_6a8;
  PriceField local_688 [23];
  allocator<char> local_671;
  key_type local_670;
  PriceField local_650 [23];
  allocator<char> local_639;
  key_type local_638;
  PriceField local_618 [23];
  allocator<char> local_601;
  key_type local_600;
  PriceField local_5e0 [23];
  allocator<char> local_5c9;
  key_type local_5c8;
  PriceField local_5a8 [23];
  allocator<char> local_591;
  key_type local_590;
  PriceField local_570 [23];
  allocator<char> local_559;
  key_type local_558;
  PriceField local_538 [23];
  allocator<char> local_521;
  key_type local_520;
  PriceField local_500 [23];
  allocator<char> local_4e9;
  key_type local_4e8;
  PriceField local_4c8 [23];
  allocator<char> local_4b1;
  key_type local_4b0;
  PriceField local_490 [23];
  allocator<char> local_479;
  key_type local_478;
  allocator<char> local_451;
  string local_450 [32];
  PriceField local_430 [23];
  allocator<char> local_419;
  key_type local_418;
  allocator<char> local_3f1;
  string local_3f0 [32];
  PriceField local_3d0 [23];
  allocator<char> local_3b9;
  key_type local_3b8;
  allocator<char> local_391;
  string local_390 [32];
  PriceField local_370 [23];
  allocator<char> local_359;
  key_type local_358;
  allocator<char> local_331;
  string local_330 [32];
  PriceField local_310 [23];
  allocator<char> local_2f9;
  key_type local_2f8;
  allocator<char> local_2d1;
  string local_2d0 [32];
  PriceField local_2b0 [23];
  allocator<char> local_299;
  key_type local_298;
  allocator<char> local_271;
  string local_270 [32];
  PriceField local_250 [23];
  allocator<char> local_239;
  key_type local_238;
  allocator<char> local_211;
  string local_210 [32];
  PriceField local_1f0 [23];
  allocator<char> local_1d9;
  key_type local_1d8;
  allocator<char> local_1b1;
  string local_1b0 [32];
  PriceField local_190 [23];
  allocator<char> local_179;
  key_type local_178;
  allocator<char> local_151;
  string local_150 [32];
  PriceField local_130 [23];
  allocator<char> local_119;
  key_type local_118;
  allocator<char> local_f1;
  string local_f0 [32];
  PriceField local_d0 [23];
  allocator<char> local_b9;
  key_type local_b8;
  PriceField local_98 [23];
  allocator<char> local_81;
  key_type local_80;
  PriceField local_50 [16];
  undefined1 local_40 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  price_map;
  SubscriptionTest_TestMergingPriceMapWithFewerBidLevelsClearsExcessLevels_Test *this_local;
  
  price_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
         *)local_40);
  bidfx_public_api::price::PriceField::PriceField(local_50,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"BidLevels",&local_81);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_80);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_50);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  bidfx_public_api::price::PriceField::~PriceField(local_50);
  bidfx_public_api::price::PriceField::PriceField(local_98,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"AskLevels",&local_b9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_b8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  bidfx_public_api::price::PriceField::~PriceField(local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"Firm1",&local_f1);
  bidfx_public_api::price::PriceField::PriceField(local_d0,local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"BidFirm1",&local_119);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_118);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_d0);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  bidfx_public_api::price::PriceField::~PriceField(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"Firm2",&local_151);
  bidfx_public_api::price::PriceField::PriceField(local_130,local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"BidFirm2",&local_179);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_178);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_130);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  bidfx_public_api::price::PriceField::~PriceField(local_130);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"Firm3",&local_1b1);
  bidfx_public_api::price::PriceField::PriceField(local_190,local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"BidFirm3",&local_1d9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_1d8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_190);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  bidfx_public_api::price::PriceField::~PriceField(local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_210,"Firm4",&local_211);
  bidfx_public_api::price::PriceField::PriceField(local_1f0,local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"BidFirm4",&local_239);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_238);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1f0);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  bidfx_public_api::price::PriceField::~PriceField(local_1f0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_270,"Firm5",&local_271);
  bidfx_public_api::price::PriceField::PriceField(local_250,local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"BidFirm5",&local_299);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_298);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_250);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  bidfx_public_api::price::PriceField::~PriceField(local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"Firm1",&local_2d1);
  bidfx_public_api::price::PriceField::PriceField(local_2b0,local_2d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"AskFirm1",&local_2f9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_2f8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_2b0);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  bidfx_public_api::price::PriceField::~PriceField(local_2b0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_330,"Firm2",&local_331);
  bidfx_public_api::price::PriceField::PriceField(local_310,local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"AskFirm2",&local_359);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_358);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_310);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  bidfx_public_api::price::PriceField::~PriceField(local_310);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_390,"Firm3",&local_391);
  bidfx_public_api::price::PriceField::PriceField(local_370,local_390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"AskFirm3",&local_3b9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_3b8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_370);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  bidfx_public_api::price::PriceField::~PriceField(local_370);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"Firm4",&local_3f1);
  bidfx_public_api::price::PriceField::PriceField(local_3d0,local_3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"AskFirm4",&local_419);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_418);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_3d0);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  bidfx_public_api::price::PriceField::~PriceField(local_3d0);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_450,"Firm5",&local_451);
  bidfx_public_api::price::PriceField::PriceField(local_430,local_450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"AskFirm5",&local_479);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_478);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_430);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  bidfx_public_api::price::PriceField::~PriceField(local_430);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator(&local_451);
  bidfx_public_api::price::PriceField::PriceField(local_490,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"BidSize1",&local_4b1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_4b0);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  bidfx_public_api::price::PriceField::~PriceField(local_490);
  bidfx_public_api::price::PriceField::PriceField(local_4c8,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"BidSize2",&local_4e9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_4e8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  bidfx_public_api::price::PriceField::~PriceField(local_4c8);
  bidfx_public_api::price::PriceField::PriceField(local_500,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"BidSize3",&local_521);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_520);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  bidfx_public_api::price::PriceField::~PriceField(local_500);
  bidfx_public_api::price::PriceField::PriceField(local_538,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"BidSize4",&local_559);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_558);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_538);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  bidfx_public_api::price::PriceField::~PriceField(local_538);
  bidfx_public_api::price::PriceField::PriceField(local_570,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"BidSize5",&local_591);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_590);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  bidfx_public_api::price::PriceField::~PriceField(local_570);
  bidfx_public_api::price::PriceField::PriceField(local_5a8,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"AskSize1",&local_5c9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_5c8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_5a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  bidfx_public_api::price::PriceField::~PriceField(local_5a8);
  bidfx_public_api::price::PriceField::PriceField(local_5e0,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"AskSize2",&local_601);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_600);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  bidfx_public_api::price::PriceField::~PriceField(local_5e0);
  bidfx_public_api::price::PriceField::PriceField(local_618,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"AskSize3",&local_639);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_638);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_618);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  bidfx_public_api::price::PriceField::~PriceField(local_618);
  bidfx_public_api::price::PriceField::PriceField(local_650,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"AskSize4",&local_671);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_670);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_650);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator(&local_671);
  bidfx_public_api::price::PriceField::~PriceField(local_650);
  bidfx_public_api::price::PriceField::PriceField(local_688,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"AskSize5",&local_6a9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_6a8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_688);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  bidfx_public_api::price::PriceField::~PriceField(local_688);
  bidfx_public_api::price::PriceField::PriceField(local_6c0,1.2304);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"Bid1",&local_6e1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_6e0);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_6c0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  bidfx_public_api::price::PriceField::~PriceField(local_6c0);
  bidfx_public_api::price::PriceField::PriceField(local_6f8,1.2303);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"Bid2",&local_719);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_718);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_6f8);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  bidfx_public_api::price::PriceField::~PriceField(local_6f8);
  bidfx_public_api::price::PriceField::PriceField(local_730,1.2302);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"Bid3",&local_751);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_750);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_730);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator(&local_751);
  bidfx_public_api::price::PriceField::~PriceField(local_730);
  bidfx_public_api::price::PriceField::PriceField(local_768,1.2301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"Bid4",&local_789);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_788);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_768);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator(&local_789);
  bidfx_public_api::price::PriceField::~PriceField(local_768);
  bidfx_public_api::price::PriceField::PriceField(local_7a0,1.23);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"Bid5",&local_7c1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_7c0);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_7a0);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  bidfx_public_api::price::PriceField::~PriceField(local_7a0);
  bidfx_public_api::price::PriceField::PriceField(local_7d8,1.2305);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"Ask1",&local_7f9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_7f8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_7d8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  bidfx_public_api::price::PriceField::~PriceField(local_7d8);
  bidfx_public_api::price::PriceField::PriceField(local_810,1.2306);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"Ask2",&local_831);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_830);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_810);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  bidfx_public_api::price::PriceField::~PriceField(local_810);
  bidfx_public_api::price::PriceField::PriceField(local_848,1.2307);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"Ask3",&local_869);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_868);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_848);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator(&local_869);
  bidfx_public_api::price::PriceField::~PriceField(local_848);
  bidfx_public_api::price::PriceField::PriceField(local_880,1.2308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"Ask4",&local_8a1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_8a0);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_880);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  bidfx_public_api::price::PriceField::~PriceField(local_880);
  bidfx_public_api::price::PriceField::PriceField(local_8b8,1.2309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"Ask5",&local_8d9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_8d8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_8b8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  bidfx_public_api::price::PriceField::~PriceField(local_8b8);
  bidfx_public_api::price::PriceField::PriceField(local_8f0,0x9c4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_910,"BidTime1",&local_911);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_910);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_8f0);
  std::__cxx11::string::~string((string *)&local_910);
  std::allocator<char>::~allocator(&local_911);
  bidfx_public_api::price::PriceField::~PriceField(local_8f0);
  bidfx_public_api::price::PriceField::PriceField(local_928,0x9c5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"BidTime2",&local_949);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_948);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator(&local_949);
  bidfx_public_api::price::PriceField::~PriceField(local_928);
  bidfx_public_api::price::PriceField::PriceField(local_960,0x9c6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"BidTime3",&local_981);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_980);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_960);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator(&local_981);
  bidfx_public_api::price::PriceField::~PriceField(local_960);
  bidfx_public_api::price::PriceField::PriceField(local_998,0x9c7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"BidTime4",&local_9b9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_9b8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_998);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  bidfx_public_api::price::PriceField::~PriceField(local_998);
  bidfx_public_api::price::PriceField::PriceField(local_9d0,0x9c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f0,"BidTime5",&local_9f1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_9f0);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  bidfx_public_api::price::PriceField::~PriceField(local_9d0);
  bidfx_public_api::price::PriceField::PriceField(local_a08,0x5dc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a28,"AskTime1",&local_a29);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_a28);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_a08);
  std::__cxx11::string::~string((string *)&local_a28);
  std::allocator<char>::~allocator(&local_a29);
  bidfx_public_api::price::PriceField::~PriceField(local_a08);
  bidfx_public_api::price::PriceField::PriceField(local_a40,0x5dd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a60,"AskTime2",&local_a61);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_a60);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_a40);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator(&local_a61);
  bidfx_public_api::price::PriceField::~PriceField(local_a40);
  bidfx_public_api::price::PriceField::PriceField(local_a78,0x5de);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a98,"AskTime3",&local_a99);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_a98);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_a78);
  std::__cxx11::string::~string((string *)&local_a98);
  std::allocator<char>::~allocator(&local_a99);
  bidfx_public_api::price::PriceField::~PriceField(local_a78);
  bidfx_public_api::price::PriceField::PriceField(local_ab0,0x5df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad0,"AskTime4",&local_ad1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_ad0);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_ab0);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::allocator<char>::~allocator(&local_ad1);
  bidfx_public_api::price::PriceField::~PriceField(local_ab0);
  bidfx_public_api::price::PriceField::PriceField(local_ae8,0x5e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b08,"AskTime5",&local_b09);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_b08);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_ae8);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator(&local_b09);
  bidfx_public_api::price::PriceField::~PriceField(local_ae8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b40,"ID-1",&local_b41);
  bidfx_public_api::price::PriceField::PriceField(local_b20,local_b40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b68,"BidID1",&local_b69);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_b68);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_b20);
  std::__cxx11::string::~string((string *)&local_b68);
  std::allocator<char>::~allocator(&local_b69);
  bidfx_public_api::price::PriceField::~PriceField(local_b20);
  std::__cxx11::string::~string(local_b40);
  std::allocator<char>::~allocator(&local_b41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ba0,"ID-2",&local_ba1);
  bidfx_public_api::price::PriceField::PriceField(local_b80,local_ba0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc8,"BidID2",&local_bc9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_bc8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_b80);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator(&local_bc9);
  bidfx_public_api::price::PriceField::~PriceField(local_b80);
  std::__cxx11::string::~string(local_ba0);
  std::allocator<char>::~allocator(&local_ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c00,"ID-3",&local_c01);
  bidfx_public_api::price::PriceField::PriceField(local_be0,local_c00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c28,"BidID3",&local_c29);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_c28);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_be0);
  std::__cxx11::string::~string((string *)&local_c28);
  std::allocator<char>::~allocator(&local_c29);
  bidfx_public_api::price::PriceField::~PriceField(local_be0);
  std::__cxx11::string::~string(local_c00);
  std::allocator<char>::~allocator(&local_c01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c60,"ID-4",&local_c61);
  bidfx_public_api::price::PriceField::PriceField(local_c40,local_c60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c88,"BidID4",&local_c89);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_c88);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_c40);
  std::__cxx11::string::~string((string *)&local_c88);
  std::allocator<char>::~allocator(&local_c89);
  bidfx_public_api::price::PriceField::~PriceField(local_c40);
  std::__cxx11::string::~string(local_c60);
  std::allocator<char>::~allocator(&local_c61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_cc0,"ID-5",&local_cc1);
  bidfx_public_api::price::PriceField::PriceField(local_ca0,local_cc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce8,"BidID5",&local_ce9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_ce8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_ca0);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::allocator<char>::~allocator(&local_ce9);
  bidfx_public_api::price::PriceField::~PriceField(local_ca0);
  std::__cxx11::string::~string(local_cc0);
  std::allocator<char>::~allocator(&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d20,"ID-1",&local_d21);
  bidfx_public_api::price::PriceField::PriceField(local_d00,local_d20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d48,"AskID1",&local_d49);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_d48);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_d00);
  std::__cxx11::string::~string((string *)&local_d48);
  std::allocator<char>::~allocator(&local_d49);
  bidfx_public_api::price::PriceField::~PriceField(local_d00);
  std::__cxx11::string::~string(local_d20);
  std::allocator<char>::~allocator(&local_d21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d80,"ID-2",&local_d81);
  bidfx_public_api::price::PriceField::PriceField(local_d60,local_d80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_da8,"AskID2",&local_da9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_da8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_d60);
  std::__cxx11::string::~string((string *)&local_da8);
  std::allocator<char>::~allocator(&local_da9);
  bidfx_public_api::price::PriceField::~PriceField(local_d60);
  std::__cxx11::string::~string(local_d80);
  std::allocator<char>::~allocator(&local_d81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_de0,"ID-3",&local_de1);
  bidfx_public_api::price::PriceField::PriceField(local_dc0,local_de0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e08,"AskID3",&local_e09);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_e08);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_dc0);
  std::__cxx11::string::~string((string *)&local_e08);
  std::allocator<char>::~allocator(&local_e09);
  bidfx_public_api::price::PriceField::~PriceField(local_dc0);
  std::__cxx11::string::~string(local_de0);
  std::allocator<char>::~allocator(&local_de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e40,"ID-4",&local_e41);
  bidfx_public_api::price::PriceField::PriceField(local_e20,local_e40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e68,"AskID4",&local_e69);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_e68);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_e20);
  std::__cxx11::string::~string((string *)&local_e68);
  std::allocator<char>::~allocator(&local_e69);
  bidfx_public_api::price::PriceField::~PriceField(local_e20);
  std::__cxx11::string::~string(local_e40);
  std::allocator<char>::~allocator(&local_e41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ea0,"ID-5",&local_ea1);
  bidfx_public_api::price::PriceField::PriceField(local_e80,local_ea0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ec8,"AskID5",&local_ec9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_ec8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_e80);
  std::__cxx11::string::~string((string *)&local_ec8);
  std::allocator<char>::~allocator(&local_ec9);
  bidfx_public_api::price::PriceField::~PriceField(local_e80);
  std::__cxx11::string::~string(local_ea0);
  std::allocator<char>::~allocator(&local_ea1);
  bidfx_public_api::price::PriceField::PriceField(local_ee0,1.0001);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f00,"BidSpot1",&local_f01);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_f00);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_ee0);
  std::__cxx11::string::~string((string *)&local_f00);
  std::allocator<char>::~allocator(&local_f01);
  bidfx_public_api::price::PriceField::~PriceField(local_ee0);
  bidfx_public_api::price::PriceField::PriceField(local_f18,1.0002);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f38,"BidSpot2",&local_f39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_f38);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_f18);
  std::__cxx11::string::~string((string *)&local_f38);
  std::allocator<char>::~allocator(&local_f39);
  bidfx_public_api::price::PriceField::~PriceField(local_f18);
  bidfx_public_api::price::PriceField::PriceField(local_f50,1.0003);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f70,"BidSpot3",&local_f71);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_f70);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_f50);
  std::__cxx11::string::~string((string *)&local_f70);
  std::allocator<char>::~allocator(&local_f71);
  bidfx_public_api::price::PriceField::~PriceField(local_f50);
  bidfx_public_api::price::PriceField::PriceField(local_f88,1.0004);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fa8,"BidSpot4",&local_fa9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_fa8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_f88);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::allocator<char>::~allocator(&local_fa9);
  bidfx_public_api::price::PriceField::~PriceField(local_f88);
  bidfx_public_api::price::PriceField::PriceField(local_fc0,1.0005);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fe0,"BidSpot5",&local_fe1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_fe0);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_fc0);
  std::__cxx11::string::~string((string *)&local_fe0);
  std::allocator<char>::~allocator(&local_fe1);
  bidfx_public_api::price::PriceField::~PriceField(local_fc0);
  bidfx_public_api::price::PriceField::PriceField(local_ff8,1.0006);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1018,"AskSpot1",&local_1019);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_1018);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_ff8);
  std::__cxx11::string::~string((string *)&local_1018);
  std::allocator<char>::~allocator(&local_1019);
  bidfx_public_api::price::PriceField::~PriceField(local_ff8);
  bidfx_public_api::price::PriceField::PriceField(local_1030,1.0007);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1050,"AskSpot2",&local_1051);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_1050);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1030);
  std::__cxx11::string::~string((string *)&local_1050);
  std::allocator<char>::~allocator(&local_1051);
  bidfx_public_api::price::PriceField::~PriceField(local_1030);
  bidfx_public_api::price::PriceField::PriceField(local_1068,1.0008);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1088,"AskSpot3",&local_1089);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_1088);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1068);
  std::__cxx11::string::~string((string *)&local_1088);
  std::allocator<char>::~allocator(&local_1089);
  bidfx_public_api::price::PriceField::~PriceField(local_1068);
  bidfx_public_api::price::PriceField::PriceField(local_10a0,1.0009);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10c0,"AskSpot4",&local_10c1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_10c0);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_10a0);
  std::__cxx11::string::~string((string *)&local_10c0);
  std::allocator<char>::~allocator(&local_10c1);
  bidfx_public_api::price::PriceField::~PriceField(local_10a0);
  bidfx_public_api::price::PriceField::PriceField(local_10d8,1.001);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10f8,"AskSpot5",&local_10f9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_10f8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_10d8);
  std::__cxx11::string::~string((string *)&local_10f8);
  std::allocator<char>::~allocator(&local_10f9);
  bidfx_public_api::price::PriceField::~PriceField(local_10d8);
  bidfx_public_api::price::PriceField::PriceField(local_1110,0.0012);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1130,"BidForwardPoints1",&local_1131);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_1130);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1110);
  std::__cxx11::string::~string((string *)&local_1130);
  std::allocator<char>::~allocator(&local_1131);
  bidfx_public_api::price::PriceField::~PriceField(local_1110);
  bidfx_public_api::price::PriceField::PriceField(local_1148,0.0022);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1168,"BidForwardPoints2",&local_1169);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_1168);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1148);
  std::__cxx11::string::~string((string *)&local_1168);
  std::allocator<char>::~allocator(&local_1169);
  bidfx_public_api::price::PriceField::~PriceField(local_1148);
  bidfx_public_api::price::PriceField::PriceField(local_1180,0.0032);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11a0,"BidForwardPoints3",&local_11a1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_11a0);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1180);
  std::__cxx11::string::~string((string *)&local_11a0);
  std::allocator<char>::~allocator(&local_11a1);
  bidfx_public_api::price::PriceField::~PriceField(local_1180);
  bidfx_public_api::price::PriceField::PriceField(local_11b8,0.0042);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11d8,"BidForwardPoints4",&local_11d9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_11d8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_11b8);
  std::__cxx11::string::~string((string *)&local_11d8);
  std::allocator<char>::~allocator(&local_11d9);
  bidfx_public_api::price::PriceField::~PriceField(local_11b8);
  bidfx_public_api::price::PriceField::PriceField(local_11f0,0.0052);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1210,"BidForwardPoints5",&local_1211);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_1210);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_11f0);
  std::__cxx11::string::~string((string *)&local_1210);
  std::allocator<char>::~allocator(&local_1211);
  bidfx_public_api::price::PriceField::~PriceField(local_11f0);
  bidfx_public_api::price::PriceField::PriceField(local_1228,0.0001);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1248,"AskForwardPoints1",&local_1249);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_1248);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1228);
  std::__cxx11::string::~string((string *)&local_1248);
  std::allocator<char>::~allocator(&local_1249);
  bidfx_public_api::price::PriceField::~PriceField(local_1228);
  bidfx_public_api::price::PriceField::PriceField(local_1260,0.0002);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1280,"AskForwardPoints2",&local_1281);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_1280);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1260);
  std::__cxx11::string::~string((string *)&local_1280);
  std::allocator<char>::~allocator(&local_1281);
  bidfx_public_api::price::PriceField::~PriceField(local_1260);
  bidfx_public_api::price::PriceField::PriceField(local_1298,0.0003);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12b8,"AskForwardPoints3",&local_12b9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_12b8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1298);
  std::__cxx11::string::~string((string *)&local_12b8);
  std::allocator<char>::~allocator(&local_12b9);
  bidfx_public_api::price::PriceField::~PriceField(local_1298);
  bidfx_public_api::price::PriceField::PriceField(local_12d0,0.0004);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12f0,"AskForwardPoints4",&local_12f1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_12f0);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_12d0);
  std::__cxx11::string::~string((string *)&local_12f0);
  std::allocator<char>::~allocator(&local_12f1);
  bidfx_public_api::price::PriceField::~PriceField(local_12d0);
  bidfx_public_api::price::PriceField::PriceField(local_1308,0.0005);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1328,"AskForwardPoints5",
             (allocator<char> *)
             ((long)&new_price_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_40,&local_1328);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1308);
  std::__cxx11::string::~string((string *)&local_1328);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&new_price_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  bidfx_public_api::price::PriceField::~PriceField(local_1308);
  bidfx_public_api::price::Subscription::MergePriceMap
            ((map *)(this->super_SubscriptionTest).subscription_,SUB81(local_40,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
         *)local_1360);
  bidfx_public_api::price::PriceField::PriceField(local_1370,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1390,"BidLevels",&local_1391);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_1360,&local_1390);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1370);
  std::__cxx11::string::~string((string *)&local_1390);
  std::allocator<char>::~allocator(&local_1391);
  bidfx_public_api::price::PriceField::~PriceField(local_1370);
  bidfx_public_api::price::PriceField::PriceField(local_13a8,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13c8,"AskLevels",&local_13c9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_1360,&local_13c8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_13a8);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::allocator<char>::~allocator(&local_13c9);
  bidfx_public_api::price::PriceField::~PriceField(local_13a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1400,"NewFirm2",&local_1401);
  bidfx_public_api::price::PriceField::PriceField(local_13e0,local_1400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1428,"BidFirm2",&local_1429);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_1360,&local_1428);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_13e0);
  std::__cxx11::string::~string((string *)&local_1428);
  std::allocator<char>::~allocator(&local_1429);
  bidfx_public_api::price::PriceField::~PriceField(local_13e0);
  std::__cxx11::string::~string(local_1400);
  std::allocator<char>::~allocator(&local_1401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1460,"NewFirm1",&local_1461);
  bidfx_public_api::price::PriceField::PriceField(local_1440,local_1460);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1488,"AskFirm1",&local_1489);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_1360,&local_1488);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_1440);
  std::__cxx11::string::~string((string *)&local_1488);
  std::allocator<char>::~allocator(&local_1489);
  bidfx_public_api::price::PriceField::~PriceField(local_1440);
  std::__cxx11::string::~string(local_1460);
  std::allocator<char>::~allocator(&local_1461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_14c0,"Firm1",&local_14c1);
  bidfx_public_api::price::PriceField::PriceField(local_14a0,local_14c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14e8,"AskFirm2",
             (allocator<char> *)((long)&result._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                         *)local_1360,&local_14e8);
  bidfx_public_api::price::PriceField::operator=(pmVar2,local_14a0);
  std::__cxx11::string::~string((string *)&local_14e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&result._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  bidfx_public_api::price::PriceField::~PriceField(local_14a0);
  std::__cxx11::string::~string(local_14c0);
  std::allocator<char>::~allocator(&local_14c1);
  bidfx_public_api::price::Subscription::MergePriceMap
            ((map *)(this->super_SubscriptionTest).subscription_,SUB81(local_1360,0));
  pmVar3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
            *)bidfx_public_api::price::Subscription::GetAllPriceFields_abi_cxx11_();
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
         *)&gtest_ar.message_,pmVar3);
  local_1538[1] = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1558,"AskLevels",&local_1559);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1558);
  local_1538[0] = bidfx_public_api::price::PriceField::GetInt();
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1530,"3","result[\"AskLevels\"].GetInt()",local_1538 + 1,
             local_1538);
  std::__cxx11::string::~string((string *)&local_1558);
  std::allocator<char>::~allocator(&local_1559);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1530);
  if (!bVar1) {
    testing::Message::Message(&local_1568);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x79,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1530);
  local_1588[1] = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_15a8,"BidLevels",&local_15a9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_15a8);
  local_1588[0] = bidfx_public_api::price::PriceField::GetInt();
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1580,"2","result[\"BidLevels\"].GetInt()",local_1588 + 1,
             local_1588);
  std::__cxx11::string::~string((string *)&local_15a8);
  std::allocator<char>::~allocator(&local_15a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1580);
  if (!bVar1) {
    testing::Message::Message(&local_15b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_15b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_15b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1610,"AskFirm1",&local_1611);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1610);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_15d0,"\"NewFirm1\"","result[\"AskFirm1\"].GetString()",
             (char (*) [9])"NewFirm1",&local_15f0);
  std::__cxx11::string::~string((string *)&local_15f0);
  std::__cxx11::string::~string((string *)&local_1610);
  std::allocator<char>::~allocator(&local_1611);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15d0);
  if (!bVar1) {
    testing::Message::Message(&local_1620);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_15d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1678,"AskFirm2",&local_1679);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1678);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_1638,"\"Firm1\"","result[\"AskFirm2\"].GetString()",
             (char (*) [6])0x3486e0,&local_1658);
  std::__cxx11::string::~string((string *)&local_1658);
  std::__cxx11::string::~string((string *)&local_1678);
  std::allocator<char>::~allocator(&local_1679);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1638);
  if (!bVar1) {
    testing::Message::Message(&local_1688);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1638);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1688);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1638);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_16e0,"AskFirm3",&local_16e1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_16e0);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_16a0,"\"Firm3\"","result[\"AskFirm3\"].GetString()",
             (char (*) [6])0x3486f2,&local_16c0);
  std::__cxx11::string::~string((string *)&local_16c0);
  std::__cxx11::string::~string((string *)&local_16e0);
  std::allocator<char>::~allocator(&local_16e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16a0);
  if (!bVar1) {
    testing::Message::Message(&local_16f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_16a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_16f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_16f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16a0);
  local_1710._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1738,"AskFirm4",&local_1739);
  local_1718._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1738);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1708,"result.end()","result.find(\"AskFirm4\")",&local_1710,
             &local_1718);
  std::__cxx11::string::~string((string *)&local_1738);
  std::allocator<char>::~allocator(&local_1739);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1708);
  if (!bVar1) {
    testing::Message::Message(&local_1748);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1708);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1708);
  local_1768._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1790,"AskFirm5",&local_1791);
  local_1770._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1790);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1760,"result.end()","result.find(\"AskFirm5\")",&local_1768,
             &local_1770);
  std::__cxx11::string::~string((string *)&local_1790);
  std::allocator<char>::~allocator(&local_1791);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1760);
  if (!bVar1) {
    testing::Message::Message(&local_17a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1760);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x7f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_17a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_17a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_17f8,"BidFirm1",&local_17f9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_17f8);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_17b8,"\"Firm1\"","result[\"BidFirm1\"].GetString()",
             (char (*) [6])0x3486e0,&local_17d8);
  std::__cxx11::string::~string((string *)&local_17d8);
  std::__cxx11::string::~string((string *)&local_17f8);
  std::allocator<char>::~allocator(&local_17f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17b8);
  if (!bVar1) {
    testing::Message::Message(&local_1808);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_17b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x80,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1808);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1860,"BidFirm2",&local_1861);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1860);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((EqHelper<false> *)local_1820,"\"NewFirm2\"","result[\"BidFirm2\"].GetString()",
             (char (*) [9])"NewFirm2",&local_1840);
  std::__cxx11::string::~string((string *)&local_1840);
  std::__cxx11::string::~string((string *)&local_1860);
  std::allocator<char>::~allocator(&local_1861);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1820);
  if (!bVar1) {
    testing::Message::Message(&local_1870);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1820);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x81,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1870);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1820);
  local_1890._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_18b8,"BidFirm3",&local_18b9);
  local_1898._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_18b8);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1888,"result.end()","result.find(\"BidFirm3\")",&local_1890,
             &local_1898);
  std::__cxx11::string::~string((string *)&local_18b8);
  std::allocator<char>::~allocator(&local_18b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1888);
  if (!bVar1) {
    testing::Message::Message(&local_18c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1888);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x82,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_18c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_18c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1888);
  local_18e8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1910,"BidFirm4",&local_1911);
  local_18f0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1910);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_18e0,"result.end()","result.find(\"BidFirm4\")",&local_18e8,
             &local_18f0);
  std::__cxx11::string::~string((string *)&local_1910);
  std::allocator<char>::~allocator(&local_1911);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18e0);
  if (!bVar1) {
    testing::Message::Message(&local_1920);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_18e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x83,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1920);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18e0);
  local_1940._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1968,"BidFirm5",&local_1969);
  local_1948._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1968);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1938,"result.end()","result.find(\"BidFirm5\")",&local_1940,
             &local_1948);
  std::__cxx11::string::~string((string *)&local_1968);
  std::allocator<char>::~allocator(&local_1969);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1938);
  if (!bVar1) {
    testing::Message::Message(&local_1978);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1938);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x84,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_1978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_1978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1938);
  local_1994 = 1000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_19c0,"BidSize1",&local_19c1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_19c0);
  local_19a0 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_1990,"1000","result[\"BidSize1\"].GetLong()",&local_1994,
             &local_19a0);
  std::__cxx11::string::~string((string *)&local_19c0);
  std::allocator<char>::~allocator(&local_19c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1990);
  if (!bVar1) {
    testing::Message::Message(&local_19d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x85,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_19d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_19d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1990);
  local_19ec = 1000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a18,"BidSize2",&local_1a19);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1a18);
  local_19f8 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_19e8,"1000","result[\"BidSize2\"].GetLong()",&local_19ec,
             &local_19f8);
  std::__cxx11::string::~string((string *)&local_1a18);
  std::allocator<char>::~allocator(&local_1a19);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19e8);
  if (!bVar1) {
    testing::Message::Message(&local_1a28);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_19e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x86,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_1a28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_1a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19e8);
  local_1a48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a70,"BidSize3",&local_1a71);
  local_1a50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1a70);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1a40,"result.end()","result.find(\"BidSize3\")",&local_1a48,
             &local_1a50);
  std::__cxx11::string::~string((string *)&local_1a70);
  std::allocator<char>::~allocator(&local_1a71);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a40);
  if (!bVar1) {
    testing::Message::Message(&local_1a80);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_1a80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_1a80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a40);
  local_1aa0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ac8,"BidSize4",&local_1ac9);
  local_1aa8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1ac8);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1a98,"result.end()","result.find(\"BidSize4\")",&local_1aa0,
             &local_1aa8);
  std::__cxx11::string::~string((string *)&local_1ac8);
  std::allocator<char>::~allocator(&local_1ac9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a98);
  if (!bVar1) {
    testing::Message::Message(&local_1ad8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x88,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_1ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_1ad8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a98);
  local_1af8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b20,"BidSize5",&local_1b21);
  local_1b00._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1b20);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1af0,"result.end()","result.find(\"BidSize5\")",&local_1af8,
             &local_1b00);
  std::__cxx11::string::~string((string *)&local_1b20);
  std::allocator<char>::~allocator(&local_1b21);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1af0);
  if (!bVar1) {
    testing::Message::Message(&local_1b30);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1af0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_1b30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_1b30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1af0);
  local_1b4c = 1000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b78,"AskSize1",&local_1b79);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1b78);
  local_1b58 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_1b48,"1000","result[\"AskSize1\"].GetLong()",&local_1b4c,
             &local_1b58);
  std::__cxx11::string::~string((string *)&local_1b78);
  std::allocator<char>::~allocator(&local_1b79);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b48);
  if (!bVar1) {
    testing::Message::Message(&local_1b88);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_1b88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_1b88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b48);
  local_1ba4 = 1000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1bd0,"AskSize2",&local_1bd1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1bd0);
  local_1bb0 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_1ba0,"1000","result[\"AskSize2\"].GetLong()",&local_1ba4,
             &local_1bb0);
  std::__cxx11::string::~string((string *)&local_1bd0);
  std::allocator<char>::~allocator(&local_1bd1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ba0);
  if (!bVar1) {
    testing::Message::Message(&local_1be0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1ba0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_1be0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_1be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ba0);
  local_1bfc = 1000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c28,"AskSize3",&local_1c29);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1c28);
  local_1c08 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_1bf8,"1000","result[\"AskSize3\"].GetLong()",&local_1bfc,
             &local_1c08);
  std::__cxx11::string::~string((string *)&local_1c28);
  std::allocator<char>::~allocator(&local_1c29);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bf8);
  if (!bVar1) {
    testing::Message::Message(&local_1c38);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1bf8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_1c38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_1c38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bf8);
  local_1c58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c80,"AskSize4",&local_1c81);
  local_1c60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1c80);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1c50,"result.end()","result.find(\"AskSize4\")",&local_1c58,
             &local_1c60);
  std::__cxx11::string::~string((string *)&local_1c80);
  std::allocator<char>::~allocator(&local_1c81);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c50);
  if (!bVar1) {
    testing::Message::Message(&local_1c90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_1c90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_1c90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c50);
  local_1cb0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1cd8,"AskSize5",&local_1cd9);
  local_1cb8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1cd8);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1ca8,"result.end()","result.find(\"AskSize5\")",&local_1cb0,
             &local_1cb8);
  std::__cxx11::string::~string((string *)&local_1cd8);
  std::allocator<char>::~allocator(&local_1cd9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ca8);
  if (!bVar1) {
    testing::Message::Message(&local_1ce8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1ca8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_1ce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_1ce8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ca8);
  local_1d08 = 1.2304;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d30,"Bid1",&local_1d31);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1d30);
  local_1d10 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_1d00,"1.2304","result[\"Bid1\"].GetDouble()",&local_1d08,
             &local_1d10);
  std::__cxx11::string::~string((string *)&local_1d30);
  std::allocator<char>::~allocator(&local_1d31);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d00);
  if (!bVar1) {
    testing::Message::Message(&local_1d40);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x8f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_1d40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_1d40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d00);
  local_1d60 = 1.2303;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d88,"Bid2",&local_1d89);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1d88);
  local_1d68 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_1d58,"1.2303","result[\"Bid2\"].GetDouble()",&local_1d60,
             &local_1d68);
  std::__cxx11::string::~string((string *)&local_1d88);
  std::allocator<char>::~allocator(&local_1d89);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d58);
  if (!bVar1) {
    testing::Message::Message(&local_1d98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x90,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_1d98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_1d98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d58);
  local_1db8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1de0,"Bid3",&local_1de1);
  local_1dc0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1de0);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1db0,"result.end()","result.find(\"Bid3\")",&local_1db8,
             &local_1dc0);
  std::__cxx11::string::~string((string *)&local_1de0);
  std::allocator<char>::~allocator(&local_1de1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1db0);
  if (!bVar1) {
    testing::Message::Message(&local_1df0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1db0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x91,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_1df0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_1df0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1db0);
  local_1e10._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e38,"Bid4",&local_1e39);
  local_1e18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1e38);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1e08,"result.end()","result.find(\"Bid4\")",&local_1e10,
             &local_1e18);
  std::__cxx11::string::~string((string *)&local_1e38);
  std::allocator<char>::~allocator(&local_1e39);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e08);
  if (!bVar1) {
    testing::Message::Message(&local_1e48);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x92,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_1e48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_1e48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e08);
  local_1e68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e90,"Bid5",&local_1e91);
  local_1e70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1e90);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1e60,"result.end()","result.find(\"Bid5\")",&local_1e68,
             &local_1e70);
  std::__cxx11::string::~string((string *)&local_1e90);
  std::allocator<char>::~allocator(&local_1e91);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e60);
  if (!bVar1) {
    testing::Message::Message(&local_1ea0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x93,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_1ea0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_1ea0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e60);
  local_1ec0 = 1.2305;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ee8,"Ask1",&local_1ee9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1ee8);
  local_1ec8 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_1eb8,"1.2305","result[\"Ask1\"].GetDouble()",&local_1ec0,
             &local_1ec8);
  std::__cxx11::string::~string((string *)&local_1ee8);
  std::allocator<char>::~allocator(&local_1ee9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1eb8);
  if (!bVar1) {
    testing::Message::Message(&local_1ef8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1eb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x94,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_1ef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_1ef8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1eb8);
  local_1f18 = 1.2306;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f40,"Ask2",&local_1f41);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1f40);
  local_1f20 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_1f10,"1.2306","result[\"Ask2\"].GetDouble()",&local_1f18,
             &local_1f20);
  std::__cxx11::string::~string((string *)&local_1f40);
  std::allocator<char>::~allocator(&local_1f41);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f10);
  if (!bVar1) {
    testing::Message::Message(&local_1f50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x95,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_1f50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_1f50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f10);
  local_1f70 = 1.2307;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f98,"Ask3",&local_1f99);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_1f98);
  local_1f78 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_1f68,"1.2307","result[\"Ask3\"].GetDouble()",&local_1f70,
             &local_1f78);
  std::__cxx11::string::~string((string *)&local_1f98);
  std::allocator<char>::~allocator(&local_1f99);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f68);
  if (!bVar1) {
    testing::Message::Message(&local_1fa8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x96,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_1fa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_1fa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f68);
  local_1fc8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ff0,"Ask4",&local_1ff1);
  local_1fd0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_1ff0);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_1fc0,"result.end()","result.find(\"Ask4\")",&local_1fc8,
             &local_1fd0);
  std::__cxx11::string::~string((string *)&local_1ff0);
  std::allocator<char>::~allocator(&local_1ff1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1fc0);
  if (!bVar1) {
    testing::Message::Message(&local_2000);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1fc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x97,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_2000);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_2000);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1fc0);
  local_2020._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2048,"Ask5",&local_2049);
  local_2028._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2048);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2018,"result.end()","result.find(\"Ask5\")",&local_2020,
             &local_2028);
  std::__cxx11::string::~string((string *)&local_2048);
  std::allocator<char>::~allocator(&local_2049);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2018);
  if (!bVar1) {
    testing::Message::Message(&local_2058);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2018);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x98,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_2058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_2058);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2018);
  local_2074 = 0x9c4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20a0,"BidTime1",&local_20a1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_20a0);
  local_2080 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_2070,"2500","result[\"BidTime1\"].GetLong()",&local_2074,
             &local_2080);
  std::__cxx11::string::~string((string *)&local_20a0);
  std::allocator<char>::~allocator(&local_20a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2070);
  if (!bVar1) {
    testing::Message::Message(&local_20b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2070);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x99,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_20b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_20b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2070);
  local_20cc = 0x9c5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20f8,"BidTime2",&local_20f9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_20f8);
  local_20d8 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_20c8,"2501","result[\"BidTime2\"].GetLong()",&local_20cc,
             &local_20d8);
  std::__cxx11::string::~string((string *)&local_20f8);
  std::allocator<char>::~allocator(&local_20f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20c8);
  if (!bVar1) {
    testing::Message::Message(&local_2108);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_20c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_2108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_2108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20c8);
  local_2128._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2150,"BidTime3",&local_2151);
  local_2130._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2150);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2120,"result.end()","result.find(\"BidTime3\")",&local_2128,
             &local_2130);
  std::__cxx11::string::~string((string *)&local_2150);
  std::allocator<char>::~allocator(&local_2151);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2120);
  if (!bVar1) {
    testing::Message::Message(&local_2160);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_2160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_2160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2120);
  local_2180._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21a8,"BidTime4",&local_21a9);
  local_2188._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_21a8);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2178,"result.end()","result.find(\"BidTime4\")",&local_2180,
             &local_2188);
  std::__cxx11::string::~string((string *)&local_21a8);
  std::allocator<char>::~allocator(&local_21a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2178);
  if (!bVar1) {
    testing::Message::Message(&local_21b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_21b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_21b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2178);
  local_21d8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2200,"BidTime5",&local_2201);
  local_21e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2200);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_21d0,"result.end()","result.find(\"BidTime5\")",&local_21d8,
             &local_21e0);
  std::__cxx11::string::~string((string *)&local_2200);
  std::allocator<char>::~allocator(&local_2201);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_21d0);
  if (!bVar1) {
    testing::Message::Message(&local_2210);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_21d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_2210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_2210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_21d0);
  local_222c = 0x5dc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2258,"AskTime1",&local_2259);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2258);
  local_2238 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_2228,"1500","result[\"AskTime1\"].GetLong()",&local_222c,
             &local_2238);
  std::__cxx11::string::~string((string *)&local_2258);
  std::allocator<char>::~allocator(&local_2259);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2228);
  if (!bVar1) {
    testing::Message::Message(&local_2268);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_2268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_2268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2228);
  local_2284 = 0x5dd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_22b0,"AskTime2",&local_22b1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_22b0);
  local_2290 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_2280,"1501","result[\"AskTime2\"].GetLong()",&local_2284,
             &local_2290);
  std::__cxx11::string::~string((string *)&local_22b0);
  std::allocator<char>::~allocator(&local_22b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2280);
  if (!bVar1) {
    testing::Message::Message(&local_22c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0x9f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_22c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_22c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2280);
  local_22dc = 0x5de;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2308,"AskTime3",&local_2309);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2308);
  local_22e8 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_22d8,"1502","result[\"AskTime3\"].GetLong()",&local_22dc,
             &local_22e8);
  std::__cxx11::string::~string((string *)&local_2308);
  std::allocator<char>::~allocator(&local_2309);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_22d8);
  if (!bVar1) {
    testing::Message::Message(&local_2318);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_22d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_2318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_2318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_22d8);
  local_2338._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2360,"AskTime4",&local_2361);
  local_2340._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2360);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2330,"result.end()","result.find(\"AskTime4\")",&local_2338,
             &local_2340);
  std::__cxx11::string::~string((string *)&local_2360);
  std::allocator<char>::~allocator(&local_2361);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2330);
  if (!bVar1) {
    testing::Message::Message(&local_2370);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_2370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_2370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2330);
  local_2390._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_23b8,"AskTime5",&local_23b9);
  local_2398._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_23b8);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2388,"result.end()","result.find(\"AskTime5\")",&local_2390,
             &local_2398);
  std::__cxx11::string::~string((string *)&local_23b8);
  std::allocator<char>::~allocator(&local_23b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2388);
  if (!bVar1) {
    testing::Message::Message(&local_23c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,&local_23c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_23c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2420,"BidID1",&local_2421);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2420);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_23e0,"\"ID-1\"","result[\"BidID1\"].GetString()",
             (char (*) [5])"ID-1",&local_2400);
  std::__cxx11::string::~string((string *)&local_2400);
  std::__cxx11::string::~string((string *)&local_2420);
  std::allocator<char>::~allocator(&local_2421);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_23e0);
  if (!bVar1) {
    testing::Message::Message(&local_2430);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_23e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_2430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_2430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_23e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2488,"BidID2",&local_2489);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2488);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_2448,"\"ID-2\"","result[\"BidID2\"].GetString()",
             (char (*) [5])"ID-2",&local_2468);
  std::__cxx11::string::~string((string *)&local_2468);
  std::__cxx11::string::~string((string *)&local_2488);
  std::allocator<char>::~allocator(&local_2489);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2448);
  if (!bVar1) {
    testing::Message::Message(&local_2498);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_2498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_2498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2448);
  local_24b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_24e0,"BidID3",&local_24e1);
  local_24c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_24e0);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_24b0,"result.end()","result.find(\"BidID3\")",&local_24b8,
             &local_24c0);
  std::__cxx11::string::~string((string *)&local_24e0);
  std::allocator<char>::~allocator(&local_24e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_24b0);
  if (!bVar1) {
    testing::Message::Message(&local_24f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_24b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_24f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_24f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_24b0);
  local_2510._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2538,"BidID4",&local_2539);
  local_2518._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2538);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2508,"result.end()","result.find(\"BidID4\")",&local_2510,
             &local_2518);
  std::__cxx11::string::~string((string *)&local_2538);
  std::allocator<char>::~allocator(&local_2539);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2508);
  if (!bVar1) {
    testing::Message::Message(&local_2548);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_2548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_2548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2508);
  local_2568._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2590,"BidID5",&local_2591);
  local_2570._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2590);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2560,"result.end()","result.find(\"BidID5\")",&local_2568,
             &local_2570);
  std::__cxx11::string::~string((string *)&local_2590);
  std::allocator<char>::~allocator(&local_2591);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2560);
  if (!bVar1) {
    testing::Message::Message(&local_25a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_25a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_25a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_25f8,"AskID1",&local_25f9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_25f8);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_25b8,"\"ID-1\"","result[\"AskID1\"].GetString()",
             (char (*) [5])"ID-1",&local_25d8);
  std::__cxx11::string::~string((string *)&local_25d8);
  std::__cxx11::string::~string((string *)&local_25f8);
  std::allocator<char>::~allocator(&local_25f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_25b8);
  if (!bVar1) {
    testing::Message::Message(&local_2608);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_25b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_2608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_2608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_25b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2660,"AskID2",&local_2661);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2660);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_2620,"\"ID-2\"","result[\"AskID2\"].GetString()",
             (char (*) [5])"ID-2",&local_2640);
  std::__cxx11::string::~string((string *)&local_2640);
  std::__cxx11::string::~string((string *)&local_2660);
  std::allocator<char>::~allocator(&local_2661);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2620);
  if (!bVar1) {
    testing::Message::Message(&local_2670);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xa9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_2670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_2670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2620);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_26c8,"AskID3",&local_26c9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_26c8);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_2688,"\"ID-3\"","result[\"AskID3\"].GetString()",
             (char (*) [5])"ID-3",&local_26a8);
  std::__cxx11::string::~string((string *)&local_26a8);
  std::__cxx11::string::~string((string *)&local_26c8);
  std::allocator<char>::~allocator(&local_26c9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2688);
  if (!bVar1) {
    testing::Message::Message(&local_26d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2688);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_50.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xaa,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_50.message_,&local_26d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
    testing::Message::~Message(&local_26d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2688);
  local_26f8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2720,"AskID4",&local_2721);
  local_2700._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2720);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_26f0,"result.end()","result.find(\"AskID4\")",&local_26f8,
             &local_2700);
  std::__cxx11::string::~string((string *)&local_2720);
  std::allocator<char>::~allocator(&local_2721);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_26f0);
  if (!bVar1) {
    testing::Message::Message(&local_2730);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_26f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xab,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,&local_2730);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(&local_2730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_26f0);
  local_2750._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2778,"AskID5",&local_2779);
  local_2758._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2778);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2748,"result.end()","result.find(\"AskID5\")",&local_2750,
             &local_2758);
  std::__cxx11::string::~string((string *)&local_2778);
  std::allocator<char>::~allocator(&local_2779);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2748);
  if (!bVar1) {
    testing::Message::Message(&local_2788);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2748);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xac,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,&local_2788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
    testing::Message::~Message(&local_2788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2748);
  local_27a8 = 1.0001;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_27d0,"BidSpot1",&local_27d1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_27d0);
  local_27b0 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_27a0,"1.0001","result[\"BidSpot1\"].GetDouble()",&local_27a8,
             &local_27b0);
  std::__cxx11::string::~string((string *)&local_27d0);
  std::allocator<char>::~allocator(&local_27d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_27a0);
  if (!bVar1) {
    testing::Message::Message(&local_27e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_27a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xad,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,&local_27e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(&local_27e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_27a0);
  local_2800 = 1.0002;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2828,"BidSpot2",&local_2829);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2828);
  local_2808 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_27f8,"1.0002","result[\"BidSpot2\"].GetDouble()",&local_2800,
             &local_2808);
  std::__cxx11::string::~string((string *)&local_2828);
  std::allocator<char>::~allocator(&local_2829);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_27f8);
  if (!bVar1) {
    testing::Message::Message(&local_2838);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_27f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_54.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xae,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_54.message_,&local_2838);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_54.message_);
    testing::Message::~Message(&local_2838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_27f8);
  local_2858._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2880,"BidSpot3",&local_2881);
  local_2860._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2880);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2850,"result.end()","result.find(\"BidSpot3\")",&local_2858,
             &local_2860);
  std::__cxx11::string::~string((string *)&local_2880);
  std::allocator<char>::~allocator(&local_2881);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2850);
  if (!bVar1) {
    testing::Message::Message(&local_2890);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2850);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xaf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_55.message_,&local_2890);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_55.message_);
    testing::Message::~Message(&local_2890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2850);
  local_28b0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28d8,"BidSpot4",&local_28d9);
  local_28b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_28d8);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_28a8,"result.end()","result.find(\"BidSpot4\")",&local_28b0,
             &local_28b8);
  std::__cxx11::string::~string((string *)&local_28d8);
  std::allocator<char>::~allocator(&local_28d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28a8);
  if (!bVar1) {
    testing::Message::Message(&local_28e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_28a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_56.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_56.message_,&local_28e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_56.message_);
    testing::Message::~Message(&local_28e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28a8);
  local_2908._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2930,"BidSpot5",&local_2931);
  local_2910._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2930);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2900,"result.end()","result.find(\"BidSpot5\")",&local_2908,
             &local_2910);
  std::__cxx11::string::~string((string *)&local_2930);
  std::allocator<char>::~allocator(&local_2931);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2900);
  if (!bVar1) {
    testing::Message::Message(&local_2940);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2900);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_57.message_,&local_2940);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_57.message_);
    testing::Message::~Message(&local_2940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2900);
  local_2960 = 1.0006;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2988,"AskSpot1",&local_2989);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2988);
  local_2968 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_2958,"1.0006","result[\"AskSpot1\"].GetDouble()",&local_2960,
             &local_2968);
  std::__cxx11::string::~string((string *)&local_2988);
  std::allocator<char>::~allocator(&local_2989);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2958);
  if (!bVar1) {
    testing::Message::Message(&local_2998);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2958);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_58.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_58.message_,&local_2998);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_58.message_);
    testing::Message::~Message(&local_2998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2958);
  local_29b8 = 1.0007;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_29e0,"AskSpot2",&local_29e1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_29e0);
  local_29c0 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_29b0,"1.0007","result[\"AskSpot2\"].GetDouble()",&local_29b8,
             &local_29c0);
  std::__cxx11::string::~string((string *)&local_29e0);
  std::allocator<char>::~allocator(&local_29e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_29b0);
  if (!bVar1) {
    testing::Message::Message(&local_29f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_29b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_59.message_,&local_29f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_59.message_);
    testing::Message::~Message(&local_29f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_29b0);
  local_2a10 = 1.0008;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a38,"AskSpot3",&local_2a39);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2a38);
  local_2a18 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_2a08,"1.0008","result[\"AskSpot3\"].GetDouble()",&local_2a10,
             &local_2a18);
  std::__cxx11::string::~string((string *)&local_2a38);
  std::allocator<char>::~allocator(&local_2a39);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a08);
  if (!bVar1) {
    testing::Message::Message(&local_2a48);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_60.message_,&local_2a48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_60.message_);
    testing::Message::~Message(&local_2a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a08);
  local_2a68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a90,"AskSpot4",&local_2a91);
  local_2a70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2a90);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2a60,"result.end()","result.find(\"AskSpot4\")",&local_2a68,
             &local_2a70);
  std::__cxx11::string::~string((string *)&local_2a90);
  std::allocator<char>::~allocator(&local_2a91);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a60);
  if (!bVar1) {
    testing::Message::Message(&local_2aa0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_61.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_61.message_,&local_2aa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_61.message_);
    testing::Message::~Message(&local_2aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a60);
  local_2ac0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2ae8,"AskSpot5",&local_2ae9);
  local_2ac8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2ae8);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2ab8,"result.end()","result.find(\"AskSpot5\")",&local_2ac0,
             &local_2ac8);
  std::__cxx11::string::~string((string *)&local_2ae8);
  std::allocator<char>::~allocator(&local_2ae9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ab8);
  if (!bVar1) {
    testing::Message::Message(&local_2af8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2ab8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_62.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_62.message_,&local_2af8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_62.message_);
    testing::Message::~Message(&local_2af8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ab8);
  local_2b18 = 0.0012;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b40,"BidForwardPoints1",&local_2b41);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2b40);
  local_2b20 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_2b10,"0.0012","result[\"BidForwardPoints1\"].GetDouble()",
             &local_2b18,&local_2b20);
  std::__cxx11::string::~string((string *)&local_2b40);
  std::allocator<char>::~allocator(&local_2b41);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b10);
  if (!bVar1) {
    testing::Message::Message(&local_2b50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2b10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_63.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_63.message_,&local_2b50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_63.message_);
    testing::Message::~Message(&local_2b50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b10);
  local_2b70 = 0.0022;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b98,"BidForwardPoints2",&local_2b99);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2b98);
  local_2b78 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_2b68,"0.0022","result[\"BidForwardPoints2\"].GetDouble()",
             &local_2b70,&local_2b78);
  std::__cxx11::string::~string((string *)&local_2b98);
  std::allocator<char>::~allocator(&local_2b99);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b68);
  if (!bVar1) {
    testing::Message::Message(&local_2ba8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2b68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_64.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_64.message_,&local_2ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_64.message_);
    testing::Message::~Message(&local_2ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b68);
  local_2bc8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2bf0,"BidForwardPoints3",&local_2bf1);
  local_2bd0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2bf0);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2bc0,"result.end()","result.find(\"BidForwardPoints3\")",
             &local_2bc8,&local_2bd0);
  std::__cxx11::string::~string((string *)&local_2bf0);
  std::allocator<char>::~allocator(&local_2bf1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2bc0);
  if (!bVar1) {
    testing::Message::Message(&local_2c00);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2bc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_65.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xb9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_65.message_,&local_2c00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_65.message_);
    testing::Message::~Message(&local_2c00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2bc0);
  local_2c20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c48,"BidForwardPoints4",&local_2c49);
  local_2c28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2c48);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2c18,"result.end()","result.find(\"BidForwardPoints4\")",
             &local_2c20,&local_2c28);
  std::__cxx11::string::~string((string *)&local_2c48);
  std::allocator<char>::~allocator(&local_2c49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c18);
  if (!bVar1) {
    testing::Message::Message(&local_2c58);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_66.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xba,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_66.message_,&local_2c58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_66.message_);
    testing::Message::~Message(&local_2c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c18);
  local_2c78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2ca0,"BidForwardPoints5",&local_2ca1);
  local_2c80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2ca0);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2c70,"result.end()","result.find(\"BidForwardPoints5\")",
             &local_2c78,&local_2c80);
  std::__cxx11::string::~string((string *)&local_2ca0);
  std::allocator<char>::~allocator(&local_2ca1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c70);
  if (!bVar1) {
    testing::Message::Message(&local_2cb0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_67.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xbb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_67.message_,&local_2cb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_67.message_);
    testing::Message::~Message(&local_2cb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c70);
  local_2cd0 = 0.0001;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2cf8,"AskForwardPoints1",&local_2cf9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2cf8);
  local_2cd8 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_2cc8,"0.0001","result[\"AskForwardPoints1\"].GetDouble()",
             &local_2cd0,&local_2cd8);
  std::__cxx11::string::~string((string *)&local_2cf8);
  std::allocator<char>::~allocator(&local_2cf9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2cc8);
  if (!bVar1) {
    testing::Message::Message(&local_2d08);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2cc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_68.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xbc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_68.message_,&local_2d08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_68.message_);
    testing::Message::~Message(&local_2d08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2cc8);
  local_2d28 = 0.0002;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d50,"AskForwardPoints2",&local_2d51);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2d50);
  local_2d30 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_2d20,"0.0002","result[\"AskForwardPoints2\"].GetDouble()",
             &local_2d28,&local_2d30);
  std::__cxx11::string::~string((string *)&local_2d50);
  std::allocator<char>::~allocator(&local_2d51);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d20);
  if (!bVar1) {
    testing::Message::Message(&local_2d60);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_69.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xbd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_69.message_,&local_2d60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_69.message_);
    testing::Message::~Message(&local_2d60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d20);
  local_2d80 = 0.0003;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2da8,"AskForwardPoints3",&local_2da9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                *)&gtest_ar.message_,&local_2da8);
  local_2d88 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_2d78,"0.0003","result[\"AskForwardPoints3\"].GetDouble()",
             &local_2d80,&local_2d88);
  std::__cxx11::string::~string((string *)&local_2da8);
  std::allocator<char>::~allocator(&local_2da9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d78);
  if (!bVar1) {
    testing::Message::Message(&local_2db8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_70.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xbe,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_70.message_,&local_2db8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_70.message_);
    testing::Message::~Message(&local_2db8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d78);
  local_2dd8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e00,"AskForwardPoints4",&local_2e01);
  local_2de0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2e00);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2dd0,"result.end()","result.find(\"AskForwardPoints4\")",
             &local_2dd8,&local_2de0);
  std::__cxx11::string::~string((string *)&local_2e00);
  std::allocator<char>::~allocator(&local_2e01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2dd0);
  if (!bVar1) {
    testing::Message::Message(&local_2e10);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2dd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_71.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xbf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_71.message_,&local_2e10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_71.message_);
    testing::Message::~Message(&local_2e10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2dd0);
  local_2e30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
              *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e58,"AskForwardPoints5",&local_2e59);
  local_2e38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)&gtest_ar.message_,&local_2e58);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
            ((EqHelper<false> *)local_2e28,"result.end()","result.find(\"AskForwardPoints5\")",
             &local_2e30,&local_2e38);
  std::__cxx11::string::~string((string *)&local_2e58);
  std::allocator<char>::~allocator(&local_2e59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e28);
  if (!bVar1) {
    testing::Message::Message(&local_2e68);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e28);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subscription_test.cpp"
               ,0xc0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2e70,&local_2e68);
    testing::internal::AssertHelper::~AssertHelper(&local_2e70);
    testing::Message::~Message(&local_2e68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e28);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *)&gtest_ar.message_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *)local_1360);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *)local_40);
  return;
}

Assistant:

TEST_F(SubscriptionTest, TestMergingPriceMapWithFewerBidLevelsClearsExcessLevels)
{
    std::map<std::string, PriceField> price_map;
    price_map["BidLevels"] = PriceField(5);
    price_map["AskLevels"] = PriceField(5);
    price_map["BidFirm1"] = PriceField("Firm1");
    price_map["BidFirm2"] = PriceField("Firm2");
    price_map["BidFirm3"] = PriceField("Firm3");
    price_map["BidFirm4"] = PriceField("Firm4");
    price_map["BidFirm5"] = PriceField("Firm5");
    price_map["AskFirm1"] = PriceField("Firm1");
    price_map["AskFirm2"] = PriceField("Firm2");
    price_map["AskFirm3"] = PriceField("Firm3");
    price_map["AskFirm4"] = PriceField("Firm4");
    price_map["AskFirm5"] = PriceField("Firm5");
    price_map["BidSize1"] = PriceField(static_cast<int64_t>(1000L));
    price_map["BidSize2"] = PriceField(static_cast<int64_t>(1000L));
    price_map["BidSize3"] = PriceField(static_cast<int64_t>(1000L));
    price_map["BidSize4"] = PriceField(static_cast<int64_t>(1000L));
    price_map["BidSize5"] = PriceField(static_cast<int64_t>(1000L));
    price_map["AskSize1"] = PriceField(static_cast<int64_t>(1000L));
    price_map["AskSize2"] = PriceField(static_cast<int64_t>(1000L));
    price_map["AskSize3"] = PriceField(static_cast<int64_t>(1000L));
    price_map["AskSize4"] = PriceField(static_cast<int64_t>(1000L));
    price_map["AskSize5"] = PriceField(static_cast<int64_t>(1000L));
    price_map["Bid1"] = PriceField(1.2304);
    price_map["Bid2"] = PriceField(1.2303);
    price_map["Bid3"] = PriceField(1.2302);
    price_map["Bid4"] = PriceField(1.2301);
    price_map["Bid5"] = PriceField(1.2300);
    price_map["Ask1"] = PriceField(1.2305);
    price_map["Ask2"] = PriceField(1.2306);
    price_map["Ask3"] = PriceField(1.2307);
    price_map["Ask4"] = PriceField(1.2308);
    price_map["Ask5"] = PriceField(1.2309);
    price_map["BidTime1"] = PriceField(static_cast<int64_t>(2500L));
    price_map["BidTime2"] = PriceField(static_cast<int64_t>(2501L));
    price_map["BidTime3"] = PriceField(static_cast<int64_t>(2502L));
    price_map["BidTime4"] = PriceField(static_cast<int64_t>(2503L));
    price_map["BidTime5"] = PriceField(static_cast<int64_t>(2504L));
    price_map["AskTime1"] = PriceField(static_cast<int64_t>(1500L));
    price_map["AskTime2"] = PriceField(static_cast<int64_t>(1501L));
    price_map["AskTime3"] = PriceField(static_cast<int64_t>(1502L));
    price_map["AskTime4"] = PriceField(static_cast<int64_t>(1503L));
    price_map["AskTime5"] = PriceField(static_cast<int64_t>(1504L));
    price_map["BidID1"] = PriceField("ID-1");
    price_map["BidID2"] = PriceField("ID-2");
    price_map["BidID3"] = PriceField("ID-3");
    price_map["BidID4"] = PriceField("ID-4");
    price_map["BidID5"] = PriceField("ID-5");
    price_map["AskID1"] = PriceField("ID-1");
    price_map["AskID2"] = PriceField("ID-2");
    price_map["AskID3"] = PriceField("ID-3");
    price_map["AskID4"] = PriceField("ID-4");
    price_map["AskID5"] = PriceField("ID-5");
    price_map["BidSpot1"] = PriceField(1.0001);
    price_map["BidSpot2"] = PriceField(1.0002);
    price_map["BidSpot3"] = PriceField(1.0003);
    price_map["BidSpot4"] = PriceField(1.0004);
    price_map["BidSpot5"] = PriceField(1.0005);
    price_map["AskSpot1"] = PriceField(1.0006);
    price_map["AskSpot2"] = PriceField(1.0007);
    price_map["AskSpot3"] = PriceField(1.0008);
    price_map["AskSpot4"] = PriceField(1.0009);
    price_map["AskSpot5"] = PriceField(1.0010);
    price_map["BidForwardPoints1"] = PriceField(0.0012);
    price_map["BidForwardPoints2"] = PriceField(0.0022);
    price_map["BidForwardPoints3"] = PriceField(0.0032);
    price_map["BidForwardPoints4"] = PriceField(0.0042);
    price_map["BidForwardPoints5"] = PriceField(0.0052);
    price_map["AskForwardPoints1"] = PriceField(0.0001);
    price_map["AskForwardPoints2"] = PriceField(0.0002);
    price_map["AskForwardPoints3"] = PriceField(0.0003);
    price_map["AskForwardPoints4"] = PriceField(0.0004);
    price_map["AskForwardPoints5"] = PriceField(0.0005);
    subscription_->MergePriceMap(price_map, false);

    std::map<std::string, PriceField> new_price_map;
    new_price_map["BidLevels"] = PriceField(2);
    new_price_map["AskLevels"] = PriceField(3);
    new_price_map["BidFirm2"] = PriceField("NewFirm2");
    new_price_map["AskFirm1"] = PriceField("NewFirm1");
    new_price_map["AskFirm2"] = PriceField("Firm1");

    subscription_->MergePriceMap(new_price_map, false);

    std::map<std::string, PriceField> result = subscription_->GetAllPriceFields();
    EXPECT_EQ(3, result["AskLevels"].GetInt());
    EXPECT_EQ(2, result["BidLevels"].GetInt());
    EXPECT_EQ("NewFirm1", result["AskFirm1"].GetString());
    EXPECT_EQ("Firm1", result["AskFirm2"].GetString());
    EXPECT_EQ("Firm3", result["AskFirm3"].GetString());
    EXPECT_EQ(result.end(), result.find("AskFirm4"));
    EXPECT_EQ(result.end(), result.find("AskFirm5"));
    EXPECT_EQ("Firm1", result["BidFirm1"].GetString());
    EXPECT_EQ("NewFirm2", result["BidFirm2"].GetString());
    EXPECT_EQ(result.end(), result.find("BidFirm3"));
    EXPECT_EQ(result.end(), result.find("BidFirm4"));
    EXPECT_EQ(result.end(), result.find("BidFirm5"));
    EXPECT_EQ(1000, result["BidSize1"].GetLong());
    EXPECT_EQ(1000, result["BidSize2"].GetLong());
    EXPECT_EQ(result.end(), result.find("BidSize3"));
    EXPECT_EQ(result.end(), result.find("BidSize4"));
    EXPECT_EQ(result.end(), result.find("BidSize5"));
    EXPECT_EQ(1000, result["AskSize1"].GetLong());
    EXPECT_EQ(1000, result["AskSize2"].GetLong());
    EXPECT_EQ(1000, result["AskSize3"].GetLong());
    EXPECT_EQ(result.end(), result.find("AskSize4"));
    EXPECT_EQ(result.end(), result.find("AskSize5"));
    EXPECT_EQ(1.2304, result["Bid1"].GetDouble());
    EXPECT_EQ(1.2303, result["Bid2"].GetDouble());
    EXPECT_EQ(result.end(), result.find("Bid3"));
    EXPECT_EQ(result.end(), result.find("Bid4"));
    EXPECT_EQ(result.end(), result.find("Bid5"));
    EXPECT_EQ(1.2305, result["Ask1"].GetDouble());
    EXPECT_EQ(1.2306, result["Ask2"].GetDouble());
    EXPECT_EQ(1.2307, result["Ask3"].GetDouble());
    EXPECT_EQ(result.end(), result.find("Ask4"));
    EXPECT_EQ(result.end(), result.find("Ask5"));
    EXPECT_EQ(2500, result["BidTime1"].GetLong());
    EXPECT_EQ(2501, result["BidTime2"].GetLong());
    EXPECT_EQ(result.end(), result.find("BidTime3"));
    EXPECT_EQ(result.end(), result.find("BidTime4"));
    EXPECT_EQ(result.end(), result.find("BidTime5"));
    EXPECT_EQ(1500, result["AskTime1"].GetLong());
    EXPECT_EQ(1501, result["AskTime2"].GetLong());
    EXPECT_EQ(1502, result["AskTime3"].GetLong());
    EXPECT_EQ(result.end(), result.find("AskTime4"));
    EXPECT_EQ(result.end(), result.find("AskTime5"));
    EXPECT_EQ("ID-1", result["BidID1"].GetString());
    EXPECT_EQ("ID-2", result["BidID2"].GetString());
    EXPECT_EQ(result.end(), result.find("BidID3"));
    EXPECT_EQ(result.end(), result.find("BidID4"));
    EXPECT_EQ(result.end(), result.find("BidID5"));
    EXPECT_EQ("ID-1", result["AskID1"].GetString());
    EXPECT_EQ("ID-2", result["AskID2"].GetString());
    EXPECT_EQ("ID-3", result["AskID3"].GetString());
    EXPECT_EQ(result.end(), result.find("AskID4"));
    EXPECT_EQ(result.end(), result.find("AskID5"));
    EXPECT_EQ(1.0001, result["BidSpot1"].GetDouble());
    EXPECT_EQ(1.0002, result["BidSpot2"].GetDouble());
    EXPECT_EQ(result.end(), result.find("BidSpot3"));
    EXPECT_EQ(result.end(), result.find("BidSpot4"));
    EXPECT_EQ(result.end(), result.find("BidSpot5"));
    EXPECT_EQ(1.0006, result["AskSpot1"].GetDouble());
    EXPECT_EQ(1.0007, result["AskSpot2"].GetDouble());
    EXPECT_EQ(1.0008, result["AskSpot3"].GetDouble());
    EXPECT_EQ(result.end(), result.find("AskSpot4"));
    EXPECT_EQ(result.end(), result.find("AskSpot5"));
    EXPECT_EQ(0.0012, result["BidForwardPoints1"].GetDouble());
    EXPECT_EQ(0.0022, result["BidForwardPoints2"].GetDouble());
    EXPECT_EQ(result.end(), result.find("BidForwardPoints3"));
    EXPECT_EQ(result.end(), result.find("BidForwardPoints4"));
    EXPECT_EQ(result.end(), result.find("BidForwardPoints5"));
    EXPECT_EQ(0.0001, result["AskForwardPoints1"].GetDouble());
    EXPECT_EQ(0.0002, result["AskForwardPoints2"].GetDouble());
    EXPECT_EQ(0.0003, result["AskForwardPoints3"].GetDouble());
    EXPECT_EQ(result.end(), result.find("AskForwardPoints4"));
    EXPECT_EQ(result.end(), result.find("AskForwardPoints5"));
}